

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::OP_InitCachedFuncs(InterpreterStackFrame *this,OpLayoutAuxNoReg *playout)

{
  Var varScope;
  AuxArray<Js::FuncInfoEntry> *info;
  FrameDisplay *pDisplay;
  
  info = ByteCodeReader::ReadAuxArray<Js::FuncInfoEntry>
                   (playout->Offset,*(FunctionBody **)(this + 0x88));
  varScope = *(Var *)(this + 0x58);
  pDisplay = GetLocalFrameDisplay(this);
  JavascriptOperators::OP_InitCachedFuncs(varScope,pDisplay,info,*(ScriptContext **)(this + 0x78));
  return;
}

Assistant:

void InterpreterStackFrame::OP_InitCachedFuncs(const unaligned OpLayoutAuxNoReg * playout)
    {
        const FuncInfoArray *info = Js::ByteCodeReader::ReadAuxArray<FuncInfoEntry>(playout->Offset, this->GetFunctionBody());
        JavascriptOperators::OP_InitCachedFuncs(this->localClosure, GetLocalFrameDisplay(), info, GetScriptContext());
    }